

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheTruncate(PCache *pCache,Pgno pgno)

{
  PgHdr *pPVar1;
  sqlite3_pcache_page *psVar2;
  sqlite3_pcache_page *pPage1;
  PgHdr *pNext;
  PgHdr *p;
  Pgno pgno_local;
  PCache *pCache_local;
  
  if (pCache->pCache != (sqlite3_pcache *)0x0) {
    pPVar1 = pCache->pDirty;
    while (pNext = pPVar1, pNext != (PgHdr *)0x0) {
      pPVar1 = pNext->pDirtyNext;
      if (pgno < pNext->pgno) {
        sqlite3PcacheMakeClean(pNext);
      }
    }
    p._4_4_ = pgno;
    if (((pgno == 0) && (pCache->nRefSum != 0)) &&
       (psVar2 = (*sqlite3Config.pcache2.xFetch)(pCache->pCache,1,0),
       psVar2 != (sqlite3_pcache_page *)0x0)) {
      memset(psVar2->pBuf,0,(long)pCache->szPage);
      p._4_4_ = 1;
    }
    (*sqlite3Config.pcache2.xTruncate)(pCache->pCache,p._4_4_ + 1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheTruncate(PCache *pCache, Pgno pgno){
  if( pCache->pCache ){
    PgHdr *p;
    PgHdr *pNext;
    pcacheTrace(("%p.TRUNCATE %d\n",pCache,pgno));
    for(p=pCache->pDirty; p; p=pNext){
      pNext = p->pDirtyNext;
      /* This routine never gets call with a positive pgno except right
      ** after sqlite3PcacheCleanAll().  So if there are dirty pages,
      ** it must be that pgno==0.
      */
      assert( p->pgno>0 );
      if( p->pgno>pgno ){
        assert( p->flags&PGHDR_DIRTY );
        sqlite3PcacheMakeClean(p);
      }
    }
    if( pgno==0 && pCache->nRefSum ){
      sqlite3_pcache_page *pPage1;
      pPage1 = sqlite3GlobalConfig.pcache2.xFetch(pCache->pCache,1,0);
      if( ALWAYS(pPage1) ){  /* Page 1 is always available in cache, because
                             ** pCache->nRefSum>0 */
        memset(pPage1->pBuf, 0, pCache->szPage);
        pgno = 1;
      }
    }
    sqlite3GlobalConfig.pcache2.xTruncate(pCache->pCache, pgno+1);
  }
}